

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

Logger * __thiscall higan::Logger::operator<<(Logger *this,Fmt *fmt)

{
  Logger *pLVar1;
  
  pLVar1 = operator<<(this,fmt->buffer_);
  return pLVar1;
}

Assistant:

Logger& Logger::operator<<(const Fmt& fmt)
{
	return *this << fmt.CStr();
}